

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O1

void __thiscall OpenMD::MatrixAccumulator::clear(MatrixAccumulator *this)

{
  uint i_3;
  ResultType *pRVar1;
  ElementType *pEVar2;
  uint i;
  long lVar3;
  uint j;
  long lVar4;
  
  (this->super_BaseAccumulator).Count_ = 0;
  pRVar1 = &this->Avg_;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      (pRVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar4] =
           (pRVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar4]
           * 0.0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar3 = lVar3 + 1;
    pRVar1 = (ResultType *)
             ((pRVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar3 != 3);
  pRVar1 = &this->Avg2_;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      (pRVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar4] =
           (pRVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar4]
           * 0.0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar3 = lVar3 + 1;
    pRVar1 = (ResultType *)
             ((pRVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar3 != 3);
  pEVar2 = &this->Val_;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      (pEVar2->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar4] =
           (pEVar2->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar4]
           * 0.0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar3 = lVar3 + 1;
    pEVar2 = (ElementType *)
             ((pEVar2->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar3 != 3);
  pRVar1 = &this->Total_;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      (pRVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar4] =
           (pRVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar4]
           * 0.0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar3 = lVar3 + 1;
    pRVar1 = (ResultType *)
             ((pRVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar3 != 3);
  return;
}

Assistant:

void clear() {
      Count_ = 0;
      Avg_ *= 0.0;
      Avg2_ *= 0.0;
      Val_ *= 0.0;
      Total_ *= 0.0;
    }